

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swapproc.c
# Opt level: O1

void ffswap8(double *dvalues,long nvals)

{
  ushort *puVar1;
  undefined1 uVar2;
  ushort uVar3;
  ushort uVar4;
  long lVar5;
  
  if (0 < nvals) {
    lVar5 = 0;
    do {
      uVar2 = *(undefined1 *)((long)dvalues + lVar5);
      *(undefined1 *)((long)dvalues + lVar5) = *(undefined1 *)((long)dvalues + lVar5 + 7);
      *(undefined1 *)((long)dvalues + lVar5 + 7) = uVar2;
      uVar3 = *(ushort *)((long)dvalues + lVar5 + 1);
      uVar4 = *(ushort *)((long)dvalues + lVar5 + 5);
      *(ushort *)((long)dvalues + lVar5 + 1) = uVar4 << 8 | uVar4 >> 8;
      *(ushort *)((long)dvalues + lVar5 + 5) = uVar3 << 8 | uVar3 >> 8;
      puVar1 = (ushort *)((long)dvalues + lVar5 + 3);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      lVar5 = lVar5 + 8;
    } while (lVar5 < nvals * 8);
  }
  return;
}

Assistant:

static void ffswap8_slow(double *dvalues, long nvals)
{
    register long ii;
#ifdef HAVE_BSWAP
    LONGLONG * llvalues = (LONGLONG*)dvalues;

    for (ii = 0; ii < nvals; ii++) {
        llvalues[ii] = __builtin_bswap64(llvalues[ii]);
    }
#elif defined(_MSC_VER) && (_MSC_VER >= 1400)
    /* intrinsic byte swapping function in Microsoft Visual C++ 8.0 and later */
    unsigned __int64 * llvalues = (unsigned __int64 *) dvalues;

    for (ii = 0; ii < nvals; ii++)
    {
        llvalues[ii] = _byteswap_uint64(llvalues[ii]);
    }
#else
    register char *cvalues;
    register char temp;

    cvalues = (char *) dvalues;      /* copy the pointer value */

    for (ii = 0; ii < nvals*8; ii += 8)
    {
        temp = cvalues[ii];
        cvalues[ii] = cvalues[ii+7];
        cvalues[ii+7] = temp;

        temp = cvalues[ii+1];
        cvalues[ii+1] = cvalues[ii+6];
        cvalues[ii+6] = temp;

        temp = cvalues[ii+2];
        cvalues[ii+2] = cvalues[ii+5];
        cvalues[ii+5] = temp;

        temp = cvalues[ii+3];
        cvalues[ii+3] = cvalues[ii+4];
        cvalues[ii+4] = temp;
    }
#endif
}